

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame)

{
  uint uVar1;
  int iVar2;
  size_t code;
  seqStore_t *in_RCX;
  BYTE *in_RSI;
  size_t in_RDI;
  ZSTD_entropyCTables_t *in_R8;
  int in_R9D;
  size_t unaff_retaddr;
  int in_stack_00000008;
  size_t err_code;
  size_t bss;
  BYTE *op;
  BYTE *ip;
  size_t cSize;
  U32 rleMaxLength;
  size_t in_stack_00000098;
  void *in_stack_000000a0;
  ZSTD_CCtx *in_stack_000000a8;
  ZSTD_CCtx *in_stack_ffffffffffffffc0;
  undefined4 uVar3;
  seqStore_t *seqStorePtr;
  void *in_stack_fffffffffffffff8;
  
  uVar3 = 0x19;
  seqStorePtr = in_RCX;
  code = ZSTD_buildSeqStore(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  uVar1 = ERR_isError(code);
  if (uVar1 == 0) {
    if (code == 1) {
      code = 0;
    }
    else {
      if (*(int *)(in_RDI + 0x378) != 0) {
        ZSTD_copyBlockSequences(in_stack_ffffffffffffffc0);
        ZSTD_blockState_confirmRepcodesAndEntropyTables((ZSTD_blockState_t *)(in_RDI + 0xc68));
        return 0;
      }
      code = ZSTD_entropyCompressSeqStore
                       (seqStorePtr,in_R8,(ZSTD_entropyCTables_t *)CONCAT44(in_R9D,uVar3),
                        (ZSTD_CCtx_params *)in_stack_ffffffffffffffc0,in_RCX,(size_t)in_RSI,in_RDI,
                        in_stack_fffffffffffffff8,unaff_retaddr,in_stack_00000008);
      if ((((in_R9D != 0) && (*(int *)(in_RDI + 0x398) == 0)) && (code < 0x19)) &&
         (iVar2 = ZSTD_isRLE((BYTE *)in_RCX,(size_t)in_RSI), iVar2 != 0)) {
        code = 1;
        *in_RSI = *(BYTE *)&in_RCX->sequencesStart;
      }
    }
    uVar1 = ZSTD_isError(0x32a6ce);
    if ((uVar1 == 0) && (1 < code)) {
      ZSTD_blockState_confirmRepcodesAndEntropyTables((ZSTD_blockState_t *)(in_RDI + 0xc68));
    }
    if (*(int *)(*(long *)(in_RDI + 0xc68) + 0x15e4) == 2) {
      *(undefined4 *)(*(long *)(in_RDI + 0xc68) + 0x15e4) = 1;
    }
  }
  return code;
}

Assistant:

static size_t
ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                            void* dst, size_t dstCapacity,
                            const void* src, size_t srcSize, U32 frame)
{
    /* This is an estimated upper bound for the length of an rle block.
     * This isn't the actual upper bound.
     * Finding the real threshold needs further investigation.
     */
    const U32 rleMaxLength = 25;
    size_t cSize;
    const BYTE* ip = (const BYTE*)src;
    BYTE* op = (BYTE*)dst;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u)",
                (unsigned)dstCapacity, (unsigned)zc->blockState.matchState.window.dictLimit,
                (unsigned)zc->blockState.matchState.nextToUpdate);

    {   const size_t bss = ZSTD_buildSeqStore(zc, src, srcSize);
        FORWARD_IF_ERROR(bss, "ZSTD_buildSeqStore failed");
        if (bss == ZSTDbss_noCompress) { cSize = 0; goto out; }
    }

    if (zc->seqCollector.collectSequences) {
        ZSTD_copyBlockSequences(zc);
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
    }

    /* encode sequences and literals */
    cSize = ZSTD_entropyCompressSeqStore(&zc->seqStore,
            &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
            &zc->appliedParams,
            dst, dstCapacity,
            srcSize,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
            zc->bmi2);

    if (frame &&
        /* We don't want to emit our first block as a RLE even if it qualifies because
         * doing so will cause the decoder (cli only) to throw a "should consume all input error."
         * This is only an issue for zstd <= v1.4.3
         */
        !zc->isFirstBlock &&
        cSize < rleMaxLength &&
        ZSTD_isRLE(ip, srcSize))
    {
        cSize = 1;
        op[0] = ip[0];
    }

out:
    if (!ZSTD_isError(cSize) && cSize > 1) {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
    }
    /* We check that dictionaries have offset codes available for the first
     * block. After the first block, the offcode table might not have large
     * enough codes to represent the offsets in the data.
     */
    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}